

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

int __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
::FindEntry<Js::RecyclableObject>
          (WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
           *this,RecyclableObject *key,hash_t hash,uint *bucket,int *previous)

{
  WeakRefDictionaryEntry<Js::RecyclableObject,_bool> *pWVar1;
  RecyclableObject *pRVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar3 = -1;
  if ((this->buckets).ptr != (int *)0x0) {
    Memory::Recycler::IsSweeping(this->recycler);
    *previous = -1;
    uVar5 = (ulong)(uint)(this->buckets).ptr[*bucket];
    while (iVar3 = (int)uVar5, -1 < iVar3) {
      pWVar1 = (this->entries).ptr;
      if (pWVar1[uVar5].hash == hash) {
        pRVar2 = (RecyclableObject *)
                 ((pWVar1[uVar5].key.ptr)->super_RecyclerWeakReferenceBase).strongRef;
        if (pRVar2 != (RecyclableObject *)0x0) {
          if (pRVar2 != key) goto LAB_0037fce4;
          goto LAB_0037fd02;
        }
        uVar4 = RemoveEntry(this,iVar3,*previous,*bucket);
        uVar5 = (ulong)uVar4;
      }
      else {
LAB_0037fce4:
        *previous = iVar3;
        uVar5 = (ulong)(uint)pWVar1[uVar5].next;
      }
    }
    uVar5 = 0xffffffffffffffff;
LAB_0037fd02:
    iVar3 = (int)uVar5;
  }
  return iVar3;
}

Assistant:

inline int FindEntry(const TLookup* key, hash_t const hash, uint& bucket, int& previous)
        {
            if (buckets != nullptr)
            {
                BOOL inSweep = this->recycler->IsSweeping();
                previous = -1;
                for (int i = buckets[bucket]; i >= 0; )
                {
                    if (entries[i].hash == hash)
                    {
                        TKey* strongRef = nullptr;

                        if (!inSweep)
                        {
                            // Quickly check for null if we're not in sweep- if it's null, it's definitely been collected
                            // so remove
                            strongRef = entries[i].key->FastGet();
                        }
                        else
                        {
                            // If we're in sweep, use the slower Get which checks if the object is getting collected
                            // This could return null too but we won't clean it up now, we'll clean it up later
                            strongRef = entries[i].key->Get();
                        }

                        if (strongRef == nullptr)
                        {
                            i = RemoveEntry(i, previous, bucket);
                            continue;
                        }
                        else
                        {
                            // if we get here, strongRef is not null
                            if (KeyComparer::Equals(strongRef, key))
                                return i;
                        }
                    }

                    previous = i;
                    i = entries[i].next;
                }
            }
            return -1;
        }